

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O2

cmServerResponse * __thiscall
cmServer::SetProtocolVersion
          (cmServerResponse *__return_storage_ptr__,cmServer *this,cmServerRequest *request)

{
  bool bVar1;
  Int major;
  int minor;
  Value *pVVar2;
  cmServerProtocol *this_00;
  Value VStack_e8;
  string errorMessage;
  Value minorValue;
  Value majorValue;
  Value requestedProtocolVersion;
  
  bVar1 = std::operator!=(&request->Type,&kHANDSHAKE_TYPE_abi_cxx11_);
  if (bVar1) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&majorValue,
                   "Waiting for type \"",&kHANDSHAKE_TYPE_abi_cxx11_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &requestedProtocolVersion,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&majorValue,
                   "\".");
    cmServerRequest::ReportError(__return_storage_ptr__,request,(string *)&requestedProtocolVersion)
    ;
    std::__cxx11::string::~string((string *)&requestedProtocolVersion);
    std::__cxx11::string::~string((string *)&majorValue);
    return __return_storage_ptr__;
  }
  pVVar2 = Json::Value::operator[](&request->Data,&kPROTOCOL_VERSION_KEY_abi_cxx11_);
  Json::Value::Value(&requestedProtocolVersion,pVVar2);
  bVar1 = Json::Value::isNull(&requestedProtocolVersion);
  if (bVar1) {
    std::operator+(&errorMessage,"\"",&kPROTOCOL_VERSION_KEY_abi_cxx11_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&VStack_e8,
                   &errorMessage,"\" is required for \"");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&minorValue,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&VStack_e8,
                   &kHANDSHAKE_TYPE_abi_cxx11_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&majorValue,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&minorValue,
                   "\".");
    cmServerRequest::ReportError(__return_storage_ptr__,request,(string *)&majorValue);
    std::__cxx11::string::~string((string *)&majorValue);
    std::__cxx11::string::~string((string *)&minorValue);
    std::__cxx11::string::~string((string *)&VStack_e8);
    pVVar2 = (Value *)&errorMessage;
  }
  else {
    bVar1 = Json::Value::isObject(&requestedProtocolVersion);
    if (bVar1) {
      pVVar2 = Json::Value::operator[](&requestedProtocolVersion,&kMAJOR_KEY_abi_cxx11_);
      Json::Value::Value(&majorValue,pVVar2);
      bVar1 = Json::Value::isInt(&majorValue);
      if (bVar1) {
        pVVar2 = Json::Value::operator[](&requestedProtocolVersion,&kMINOR_KEY_abi_cxx11_);
        Json::Value::Value(&minorValue,pVVar2);
        bVar1 = Json::Value::isNull(&minorValue);
        if ((bVar1) || (bVar1 = Json::Value::isInt(&minorValue), bVar1)) {
          major = Json::Value::asInt(&majorValue);
          bVar1 = Json::Value::isNull(&minorValue);
          if (bVar1) {
            minor = -1;
          }
          else {
            minor = Json::Value::asInt(&minorValue);
          }
          if (major < 0) {
            std::operator+(&errorMessage,"\"",&kMAJOR_KEY_abi_cxx11_);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &VStack_e8,&errorMessage,"\" must be >= 0.");
            cmServerRequest::ReportError(__return_storage_ptr__,request,(string *)&VStack_e8);
            goto LAB_0042b0fa;
          }
          bVar1 = Json::Value::isNull(&minorValue);
          pVVar2 = &VStack_e8;
          if (minor < 0 && !bVar1) {
            std::operator+(&errorMessage,"\"",&kMINOR_KEY_abi_cxx11_);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &VStack_e8,&errorMessage,"\" must be >= 0 when set.");
            cmServerRequest::ReportError(__return_storage_ptr__,request,(string *)&VStack_e8);
            goto LAB_0042b0fa;
          }
          this_00 = FindMatchingProtocol(&this->SupportedProtocols,major,minor);
          this->Protocol = this_00;
          if (this_00 != (cmServerProtocol *)0x0) {
            errorMessage._M_dataplus._M_p = (pointer)&errorMessage.field_2;
            errorMessage._M_string_length = 0;
            errorMessage.field_2._M_local_buf[0] = '\0';
            bVar1 = cmServerProtocol::Activate(this_00,this,request,&errorMessage);
            if (!bVar1) {
              this->Protocol = (cmServerProtocol *)0x0;
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &VStack_e8,"Failed to activate protocol version: ",&errorMessage);
              cmServerRequest::ReportError(__return_storage_ptr__,request,(string *)&VStack_e8);
              goto LAB_0042b0fa;
            }
            Json::Value::Value(&VStack_e8,objectValue);
            cmServerRequest::Reply(__return_storage_ptr__,request,&VStack_e8);
            Json::Value::~Value(&VStack_e8);
            goto LAB_0042b102;
          }
          std::__cxx11::string::string
                    ((string *)&VStack_e8,"Protocol version not supported.",
                     (allocator *)&errorMessage);
          cmServerRequest::ReportError(__return_storage_ptr__,request,(string *)&VStack_e8);
        }
        else {
          std::operator+(&errorMessage,"\"",&kMINOR_KEY_abi_cxx11_);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &VStack_e8,&errorMessage,"\" must be unset or an integer.");
          cmServerRequest::ReportError(__return_storage_ptr__,request,(string *)&VStack_e8);
LAB_0042b0fa:
          std::__cxx11::string::~string((string *)&VStack_e8);
LAB_0042b102:
          pVVar2 = (Value *)&errorMessage;
        }
        std::__cxx11::string::~string((string *)pVVar2);
        Json::Value::~Value(&minorValue);
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &VStack_e8,"\"",&kMAJOR_KEY_abi_cxx11_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &minorValue,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &VStack_e8,"\" must be set and an integer.");
        cmServerRequest::ReportError(__return_storage_ptr__,request,(string *)&minorValue);
        std::__cxx11::string::~string((string *)&minorValue);
        std::__cxx11::string::~string((string *)&VStack_e8);
      }
      Json::Value::~Value(&majorValue);
      goto LAB_0042b120;
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&minorValue,
                   "\"",&kPROTOCOL_VERSION_KEY_abi_cxx11_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&majorValue,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&minorValue,
                   "\" must be a JSON object.");
    cmServerRequest::ReportError(__return_storage_ptr__,request,(string *)&majorValue);
    std::__cxx11::string::~string((string *)&majorValue);
    pVVar2 = &minorValue;
  }
  std::__cxx11::string::~string((string *)pVVar2);
LAB_0042b120:
  Json::Value::~Value(&requestedProtocolVersion);
  return __return_storage_ptr__;
}

Assistant:

cmServerResponse cmServer::SetProtocolVersion(const cmServerRequest& request)
{
  if (request.Type != kHANDSHAKE_TYPE) {
    return request.ReportError("Waiting for type \"" + kHANDSHAKE_TYPE +
                               "\".");
  }

  Json::Value requestedProtocolVersion = request.Data[kPROTOCOL_VERSION_KEY];
  if (requestedProtocolVersion.isNull()) {
    return request.ReportError("\"" + kPROTOCOL_VERSION_KEY +
                               "\" is required for \"" + kHANDSHAKE_TYPE +
                               "\".");
  }

  if (!requestedProtocolVersion.isObject()) {
    return request.ReportError("\"" + kPROTOCOL_VERSION_KEY +
                               "\" must be a JSON object.");
  }

  Json::Value majorValue = requestedProtocolVersion[kMAJOR_KEY];
  if (!majorValue.isInt()) {
    return request.ReportError("\"" + kMAJOR_KEY +
                               "\" must be set and an integer.");
  }

  Json::Value minorValue = requestedProtocolVersion[kMINOR_KEY];
  if (!minorValue.isNull() && !minorValue.isInt()) {
    return request.ReportError("\"" + kMINOR_KEY +
                               "\" must be unset or an integer.");
  }

  const int major = majorValue.asInt();
  const int minor = minorValue.isNull() ? -1 : minorValue.asInt();
  if (major < 0) {
    return request.ReportError("\"" + kMAJOR_KEY + "\" must be >= 0.");
  }
  if (!minorValue.isNull() && minor < 0) {
    return request.ReportError("\"" + kMINOR_KEY +
                               "\" must be >= 0 when set.");
  }

  this->Protocol =
    this->FindMatchingProtocol(this->SupportedProtocols, major, minor);
  if (!this->Protocol) {
    return request.ReportError("Protocol version not supported.");
  }

  std::string errorMessage;
  if (!this->Protocol->Activate(this, request, &errorMessage)) {
    this->Protocol = CM_NULLPTR;
    return request.ReportError("Failed to activate protocol version: " +
                               errorMessage);
  }
  return request.Reply(Json::objectValue);
}